

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_tec_ed2_zone(REF_GRID ref_grid,FILE *file)

{
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 uVar5;
  int cell;
  char *pcVar6;
  REF_NODE pRVar7;
  REF_INT cell_00;
  long lVar8;
  uint cell_id;
  REF_INT nnode;
  REF_INT nedge;
  REF_INT *g2l;
  REF_DICT ref_dict;
  REF_INT *l2g;
  REF_INT nodes [27];
  uint local_e0;
  int local_dc;
  REF_INT *local_d8;
  REF_DICT local_d0;
  REF_INT *local_c8;
  REF_GRID local_c0;
  long local_b8;
  REF_NODE local_b0;
  uint local_a8 [30];
  
  pRVar7 = ref_grid->node;
  uVar2 = ref_dict_create(&local_d0);
  if (uVar2 == 0) {
    ref_cell = ref_grid->cell[1];
    local_c0 = ref_grid;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_a8);
        if ((RVar3 == 0) &&
           (uVar2 = ref_dict_store(local_d0,local_a8[ref_cell->node_per],-1), uVar2 != 0)) {
          pcVar6 = "mark tri";
          uVar5 = 300;
          goto LAB_00124963;
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    if (local_d0->n < 1) {
LAB_00124910:
      uVar2 = ref_dict_free(local_d0);
      if (uVar2 == 0) {
        return 0;
      }
      pcVar6 = "free dict";
      uVar5 = 0x14a;
    }
    else {
      cell_id = *local_d0->key;
      uVar2 = ref_grid_cell_id_nodes
                        (local_c0,ref_cell,cell_id,(REF_INT *)&local_e0,&local_dc,&local_d8,
                         &local_c8);
      if (uVar2 == 0) {
        local_b8 = 0;
        local_b0 = pRVar7;
        do {
          fprintf((FILE *)file,
                  "zone t=\"p2edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)cell_id,(ulong)local_e0,(ulong)(uint)(local_dc * 2),"point","felineseg");
          if (0 < (int)local_e0) {
            lVar8 = 0;
            do {
              pRVar1 = pRVar7->real;
              lVar4 = (long)local_c8[lVar8];
              fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar1[lVar4 * 0xf],
                      pRVar1[lVar4 * 0xf + 1],pRVar1[lVar4 * 0xf + 2]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)local_e0);
          }
          if (0 < ref_cell->max) {
            cell_00 = 0;
            do {
              RVar3 = ref_cell_nodes(ref_cell,cell_00,(REF_INT *)local_a8);
              if ((RVar3 == 0) && (cell_id == local_a8[ref_cell->node_per])) {
                fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[0]] + 1),
                        (ulong)(local_d8[(int)local_a8[2]] + 1));
                pRVar7 = local_b0;
                fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[2]] + 1),
                        (ulong)(local_d8[(int)local_a8[1]] + 1));
              }
              cell_00 = cell_00 + 1;
            } while (cell_00 < ref_cell->max);
          }
          if (local_c8 != (REF_INT *)0x0) {
            free(local_c8);
          }
          if (local_d8 != (REF_INT *)0x0) {
            free(local_d8);
          }
          lVar8 = local_b8 + 1;
          if (local_d0->n <= lVar8) goto LAB_00124910;
          cell_id = local_d0->key[lVar8];
          local_b8 = lVar8;
          uVar2 = ref_grid_cell_id_nodes
                            (local_c0,ref_cell,cell_id,(REF_INT *)&local_e0,&local_dc,&local_d8,
                             &local_c8);
        } while (uVar2 == 0);
      }
      pcVar6 = "extract this edge";
      uVar5 = 0x132;
    }
  }
  else {
    pcVar6 = "create dict";
    uVar5 = 0x127;
  }
LAB_00124963:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar5,
         "ref_export_tec_ed2_zone",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_ed2_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nedge;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_ed2(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
        "mark tri");
  }

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_cell_id_nodes(ref_grid, ref_cell, boundary_tag, &nnode, &nedge,
                               &g2l, &l2g),
        "extract this edge");

    fprintf(file,
            "zone t=\"p2edge%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, 2 * nedge, "point", "felineseg");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        fprintf(file, " %d %d\n", g2l[nodes[0]] + 1, g2l[nodes[2]] + 1);
        fprintf(file, " %d %d\n", g2l[nodes[2]] + 1, g2l[nodes[1]] + 1);
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}